

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_machoread.c
# Opt level: O1

int macho_get_section_info
              (void *obj,Dwarf_Unsigned section_index,Dwarf_Obj_Access_Section_a *return_section,
              int *error)

{
  long lVar1;
  int iVar2;
  long lVar3;
  
  iVar2 = -1;
  if (section_index < *(ulong *)((long)obj + 200)) {
    lVar1 = *(long *)((long)obj + 0xd0);
    lVar3 = section_index * 0xa0;
    return_section->as_name = *(char **)(lVar1 + 0x30 + lVar3);
    return_section->as_type = 0;
    return_section->as_flags = *(Dwarf_Unsigned *)(lVar1 + 0x68 + lVar3);
    return_section->as_addr = *(Dwarf_Addr *)(lVar1 + 0x38 + lVar3);
    return_section->as_offset = *(Dwarf_Unsigned *)(lVar1 + 0x48 + lVar3);
    return_section->as_size = *(Dwarf_Unsigned *)(lVar1 + 0x40 + lVar3);
    return_section->as_link = 0;
    return_section->as_info = 0;
    return_section->as_addralign = 0;
    return_section->as_entrysize = 0;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int macho_get_section_info (void *obj,
    Dwarf_Unsigned section_index,
    Dwarf_Obj_Access_Section_a *return_section,
    int *error)
{
    dwarf_macho_object_access_internals_t *macho =
        (dwarf_macho_object_access_internals_t*)(obj);

    (void)error;
    if (section_index < macho->mo_dwarf_sectioncount) {
        struct generic_macho_section *sp = 0;

        sp = macho->mo_dwarf_sections + section_index;
        return_section->as_name   = sp->dwarfsectname;
        return_section->as_type   = 0;
        return_section->as_flags  = sp->flags;
        return_section->as_addr   = sp->addr;
        return_section->as_offset = sp->offset;
        return_section->as_size   = sp->size;
        return_section->as_link   = 0;
        return_section->as_info   = 0;
        return_section->as_addralign = 0;
        return_section->as_entrysize = 0;
        return DW_DLV_OK;
    }
    return DW_DLV_NO_ENTRY;
}